

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O1

void __thiscall JoystickManager::changeMasterGain(JoystickManager *this,float dDeltaPercent)

{
  ForceFeedback *pFVar1;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 in_RDX;
  undefined8 in_RSI;
  float fVar2;
  float fVar3;
  
  if (-1 < (long)this->_nCurrJoyInd) {
    fVar2 = dDeltaPercent / 100.0 + this->_dMasterGain;
    this->_dMasterGain = fVar2;
    fVar3 = 1.0;
    if ((1.0 < fVar2) || (fVar3 = 0.0, fVar2 < 0.0)) {
      this->_dMasterGain = fVar3;
    }
    pFVar1 = (this->_vecFFDev).
             super__Vector_base<OIS::ForceFeedback_*,_std::allocator<OIS::ForceFeedback_*>_>._M_impl
             .super__Vector_impl_data._M_start[this->_nCurrJoyInd];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pFVar1 + 0x10);
    (*UNRECOVERED_JUMPTABLE)(this->_dMasterGain,pFVar1,in_RSI,in_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void changeMasterGain(float dDeltaPercent)
	{
		if(_nCurrJoyInd >= 0)
		{
			_dMasterGain += dDeltaPercent / 100;
			if(_dMasterGain > 1.0)
				_dMasterGain = 1.0;
			else if(_dMasterGain < 0.0)
				_dMasterGain = 0.0;

			_vecFFDev[_nCurrJoyInd]->setMasterGain(_dMasterGain);
		}
	}